

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_intersection.c
# Opt level: O0

int array_bitset_container_intersection_cardinality
              (array_container_t *src_1,bitset_container_t *src_2)

{
  int iVar1;
  _Bool _Var2;
  int *in_RDI;
  uint16_t key;
  int i;
  int32_t origcard;
  int32_t newcard;
  uint16_t in_stack_ffffffffffffffde;
  undefined2 in_stack_ffffffffffffffe0;
  int iVar3;
  int local_14;
  
  local_14 = 0;
  iVar1 = *in_RDI;
  for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
    _Var2 = bitset_container_contains
                      ((bitset_container_t *)
                       CONCAT44(iVar3,CONCAT22(*(undefined2 *)
                                                (*(long *)(in_RDI + 2) + (long)iVar3 * 2),
                                               in_stack_ffffffffffffffe0)),in_stack_ffffffffffffffde
                      );
    local_14 = (uint)_Var2 + local_14;
  }
  return local_14;
}

Assistant:

int array_bitset_container_intersection_cardinality(
    const array_container_t *src_1, const bitset_container_t *src_2) {
    int32_t newcard = 0;
    const int32_t origcard = src_1->cardinality;
    for (int i = 0; i < origcard; ++i) {
        uint16_t key = src_1->array[i];
        newcard += bitset_container_contains(src_2, key);
    }
    return newcard;
}